

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> * __thiscall
testing::internal::MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>
::operator=(MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *this,
           MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *other)

{
  MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *other_local;
  MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }